

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

bool __thiscall IntBounds::SetIsNot(IntBounds *this,Value *value,bool isExplicit)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  bool local_6a;
  bool local_69;
  ValueRelativeOffset *pVStack_58;
  bool existingUpperBoundOffsetIsZero;
  ValueRelativeOffset *existingUpperBound;
  ValueRelativeOffset *pVStack_48;
  bool existingLowerBoundOffsetIsZero;
  ValueRelativeOffset *existingLowerBound;
  byte local_35;
  ValueNumber valueNumber;
  bool changed;
  ValueInfo *pVStack_30;
  int constantValue;
  ValueInfo *valueInfo;
  Value *pVStack_20;
  bool isExplicit_local;
  Value *value_local;
  IntBounds *this_local;
  
  valueInfo._7_1_ = isExplicit;
  pVStack_20 = value;
  value_local = (Value *)this;
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x108,"(value)","value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pVStack_30 = ::Value::GetValueInfo(pVStack_20);
  bVar2 = ValueType::IsLikelyInt(&pVStack_30->super_ValueType);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x10b,"(valueInfo->IsLikelyInt())","valueInfo->IsLikelyInt()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = ValueInfo::TryGetIntConstantValue(pVStack_30,(int32 *)&valueNumber,true);
  if (bVar2) {
    local_35 = SetIsNot(this,valueNumber,(bool)(valueInfo._7_1_ & 1));
    bVar2 = ValueType::IsInt(&pVStack_30->super_ValueType);
    if (bVar2) {
      return (bool)(local_35 & 1);
    }
  }
  else {
    local_35 = 0;
  }
  existingLowerBound._4_4_ = ::Value::GetValueNumber(pVStack_20);
  pVStack_48 = (ValueRelativeOffset *)0x0;
  bVar2 = JsUtil::
          BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>
                    (&(this->relativeLowerBounds).
                      super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     ,(uint *)((long)&existingLowerBound + 4),&stack0xffffffffffffffb8);
  local_69 = false;
  if (bVar2) {
    iVar3 = ValueRelativeOffset::Offset(pVStack_48);
    local_69 = iVar3 == 0;
  }
  existingUpperBound._7_1_ = local_69;
  pVStack_58 = (ValueRelativeOffset *)0x0;
  bVar2 = JsUtil::
          BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>
                    (&(this->relativeUpperBounds).
                      super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     ,(uint *)((long)&existingLowerBound + 4),&stack0xffffffffffffffa8);
  local_6a = false;
  if (bVar2) {
    iVar3 = ValueRelativeOffset::Offset(pVStack_58);
    local_6a = iVar3 == 0;
  }
  if ((bool)(existingUpperBound._7_1_ & 1) == local_6a) {
    this_local._7_1_ = (bool)(local_35 & 1);
  }
  else {
    if ((existingUpperBound._7_1_ & 1) == 0) {
      ValueRelativeOffset::SetOffset(pVStack_58,-1);
      if ((valueInfo._7_1_ & 1) != 0) {
        ValueRelativeOffset::SetWasEstablishedExplicitly(pVStack_58);
      }
    }
    else {
      ValueRelativeOffset::SetOffset(pVStack_48,1);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IntBounds::SetIsNot(const Value *const value, const bool isExplicit)
{
    Assert(value);

    ValueInfo const *const valueInfo = value->GetValueInfo();
    Assert(valueInfo->IsLikelyInt());

    int constantValue;
    bool changed;
    if(valueInfo->TryGetIntConstantValue(&constantValue, true))
    {
        changed = SetIsNot(constantValue, isExplicit);
        if(valueInfo->IsInt())
            return changed;
    }
    else
        changed = false;

    const ValueNumber valueNumber = value->GetValueNumber();
    ValueRelativeOffset *existingLowerBound = nullptr;
    const bool existingLowerBoundOffsetIsZero =
        relativeLowerBounds.TryGetReference(valueNumber, &existingLowerBound) && existingLowerBound->Offset() == 0;
    ValueRelativeOffset *existingUpperBound = nullptr;
    const bool existingUpperBoundOffsetIsZero =
        relativeUpperBounds.TryGetReference(valueNumber, &existingUpperBound) && existingUpperBound->Offset() == 0;
    if(existingLowerBoundOffsetIsZero == existingUpperBoundOffsetIsZero)
        return changed; // neither bound can be changed, or changing a bound would contradict the opposite bound
    if(existingLowerBoundOffsetIsZero)
        existingLowerBound->SetOffset(1);
    else
    {
        existingUpperBound->SetOffset(-1);
        if(isExplicit)
            existingUpperBound->SetWasEstablishedExplicitly();
    }
    return true;
}